

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

int duckdb::History::SetMaxLength(idx_t len)

{
  ulong uVar1;
  void *__s;
  ulong in_RDI;
  idx_t j;
  idx_t tocopy;
  char **new_entry;
  ulong local_28;
  ulong local_20;
  int local_4;
  
  uVar1 = history_len;
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    if (history != (void *)0x0) {
      local_20 = history_len;
      __s = malloc(in_RDI << 3);
      if (__s == (void *)0x0) {
        return 0;
      }
      if (in_RDI < uVar1) {
        for (local_28 = 0; local_20 = in_RDI, local_28 < uVar1 - in_RDI; local_28 = local_28 + 1) {
          free(*(void **)((long)history + local_28 * 8));
        }
      }
      memset(__s,0,in_RDI << 3);
      memcpy(__s,(void *)((long)history + (history_len - local_20) * 8),local_20 << 3);
      free(history);
      history = __s;
    }
    if (in_RDI < history_len) {
      history_len = in_RDI;
    }
    local_4 = 1;
    history_max_len = in_RDI;
  }
  return local_4;
}

Assistant:

int History::SetMaxLength(idx_t len) {
	char **new_entry;

	if (len < 1) {
		return 0;
	}
	if (history) {
		idx_t tocopy = history_len;

		new_entry = (char **)malloc(sizeof(char *) * len);
		if (new_entry == nullptr) {
			return 0;
		}

		/* If we can't copy everything, free the elements we'll not use. */
		if (len < tocopy) {
			for (idx_t j = 0; j < tocopy - len; j++) {
				free(history[j]);
			}
			tocopy = len;
		}
		memset(new_entry, 0, sizeof(char *) * len);
		memcpy(new_entry, history + (history_len - tocopy), sizeof(char *) * tocopy);
		free(history);
		history = new_entry;
	}
	history_max_len = len;
	if (history_len > history_max_len) {
		history_len = history_max_len;
	}
	return 1;
}